

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

JavascriptString *
Js::JavascriptNumber::ToLocaleStringNanOrInfinite(double value,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  UINT cchUseLength;
  JavascriptString *pJVar3;
  undefined4 *puVar4;
  BSTR bstr;
  int32 isz;
  
  bVar2 = NumberUtilities::IsFinite(value);
  if (bVar2) {
    pJVar3 = (JavascriptString *)0x0;
  }
  else {
    bVar2 = NumberUtilities::IsNan(value);
    if (bVar2) {
      pJVar3 = StringCache::GetNaNDisplay
                         (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache
                         );
      return pJVar3;
    }
    bVar2 = NumberUtilities::IsSpecial(value,0x7ff0000000000000);
    isz = 6000;
    if (!bVar2) {
      bVar2 = NumberUtilities::IsSpecial(value,0xfff0000000000000);
      isz = 0x1771;
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                    ,0x428,"(IsNegInf(value))","bad handling of infinite number");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
    bstr = BstrGetResourceString(isz);
    if (bstr == (BSTR)0x0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
    }
    cchUseLength = SysStringLen(bstr);
    pJVar3 = JavascriptString::NewCopyBuffer(bstr,cchUseLength,scriptContext);
    SysFreeString(bstr);
  }
  return pJVar3;
}

Assistant:

JavascriptString* JavascriptNumber::ToLocaleStringNanOrInfinite(double value, ScriptContext* scriptContext)
    {
        if (!NumberUtilities::IsFinite(value))
        {
            if (IsNan(value))
            {
                return ToStringNan(scriptContext);
            }

            BSTR bstr = nullptr;
            if (IsPosInf(value))
            {
                bstr = BstrGetResourceString(IDS_INFINITY);
            }
            else
            {
                AssertMsg(IsNegInf(value), "bad handling of infinite number");
                bstr = BstrGetResourceString(IDS_MINUSINFINITY);
            }

            if (bstr == nullptr)
            {
                Js::JavascriptError::ThrowTypeError(scriptContext, VBSERR_InternalError);
            }
            JavascriptString* str = JavascriptString::NewCopyBuffer(bstr, SysStringLen(bstr), scriptContext);
            SysFreeString(bstr);
            return str;
        }
        return nullptr;
    }